

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

void google::protobuf::internal::arena_destruct_object<std::__cxx11::string>(void *object)

{
  string *in_RDI;
  
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

void arena_destruct_object(void* object) {
  reinterpret_cast<T*>(object)->~T();
}